

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O3

void gflags::ShowXMLOfFlags(char *prog_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *pFVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pCVar6;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> flags;
  allocator<char> local_89;
  string local_88;
  gflags *local_68;
  string *local_60;
  long local_58 [2];
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> local_48;
  
  local_48.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetAllFlags(&local_48);
  fwrite("<?xml version=\"1.0\"?>\n",0x16,1,_stdout);
  fwrite("<AllFlags>\n",0xb,1,_stdout);
  pFVar2 = _stdout;
  pcVar4 = strrchr(prog_name,0x2f);
  pcVar5 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar5 = prog_name;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar5,&local_89);
  XMLText(&local_88,local_68,local_60);
  paVar1 = &local_88.field_2;
  fprintf(pFVar2,"<program>%s</program>\n",local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT17(local_88.field_2._M_local_buf[7],
                             CONCAT16(local_88.field_2._M_local_buf[6],
                                      CONCAT24(local_88.field_2._M_allocated_capacity._4_2_,
                                               local_88.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if (local_68 != (gflags *)local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  pFVar2 = _stdout;
  pcVar5 = ProgramUsage();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar5,&local_89);
  XMLText(&local_88,local_68,local_60);
  fprintf(pFVar2,"<usage>%s</usage>\n",local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT17(local_88.field_2._M_local_buf[7],
                             CONCAT16(local_88.field_2._M_local_buf[6],
                                      CONCAT24(local_88.field_2._M_allocated_capacity._4_2_,
                                               local_88.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if (local_68 != (gflags *)local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pCVar6 = local_48.
             super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = std::__cxx11::string::compare((char *)&pCVar6->description);
      pFVar2 = _stdout;
      if (iVar3 != 0) {
        local_88.field_2._M_allocated_capacity._4_2_ = 0x3e67;
        local_88.field_2._M_allocated_capacity._0_4_ = 0x616c663c;
        local_88._M_string_length = 6;
        local_88.field_2._M_local_buf[6] = '\0';
        local_88._M_dataplus._M_p = (pointer)paVar1;
        AddXMLTag((gflags *)&local_88,(string *)0x127de1,(pCVar6->filename)._M_dataplus._M_p,
                  (string *)(pCVar6->filename)._M_string_length);
        AddXMLTag((gflags *)&local_88,(string *)0x1270de,(pCVar6->name)._M_dataplus._M_p,
                  (string *)(pCVar6->name)._M_string_length);
        AddXMLTag((gflags *)&local_88,(string *)"meaning",(pCVar6->description)._M_dataplus._M_p,
                  (string *)(pCVar6->description)._M_string_length);
        AddXMLTag((gflags *)&local_88,(string *)"default",(pCVar6->default_value)._M_dataplus._M_p,
                  (string *)(pCVar6->default_value)._M_string_length);
        AddXMLTag((gflags *)&local_88,(string *)"current",(pCVar6->current_value)._M_dataplus._M_p,
                  (string *)(pCVar6->current_value)._M_string_length);
        AddXMLTag((gflags *)&local_88,(string *)0x1271bf,(pCVar6->type)._M_dataplus._M_p,
                  (string *)(pCVar6->type)._M_string_length);
        std::__cxx11::string::append((char *)&local_88);
        fprintf(pFVar2,"%s\n",local_88._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT17(local_88.field_2._M_local_buf[7],
                                   CONCAT16(local_88.field_2._M_local_buf[6],
                                            CONCAT24(local_88.field_2._M_allocated_capacity._4_2_,
                                                     local_88.field_2._M_allocated_capacity._0_4_)))
                          + 1);
        }
      }
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != local_48.
                       super__Vector_base<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  fwrite("</AllFlags>\n",0xc,1,_stdout);
  std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::~vector
            (&local_48);
  return;
}

Assistant:

static void ShowXMLOfFlags(const char *prog_name) {
  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);   // flags are sorted: by filename, then flagname

  // XML.  There is no corresponding schema yet
  fprintf(stdout, "<?xml version=\"1.0\"?>\n");
  // The document
  fprintf(stdout, "<AllFlags>\n");
  // the program name and usage
  fprintf(stdout, "<program>%s</program>\n",
          XMLText(Basename(prog_name)).c_str());
  fprintf(stdout, "<usage>%s</usage>\n",
          XMLText(ProgramUsage()).c_str());
  // All the flags
  for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
       flag != flags.end();
       ++flag) {
    if (flag->description != kStrippedFlagHelp)
      fprintf(stdout, "%s\n", DescribeOneFlagInXML(*flag).c_str());
  }
  // The end of the document
  fprintf(stdout, "</AllFlags>\n");
}